

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderstyle.cpp
# Opt level: O2

bool __thiscall FRenderStyle::IsVisible(FRenderStyle *this,double alpha)

{
  FRenderStyle FVar1;
  double dVar2;
  double dVar3;
  
  FVar1 = *this;
  if (FVar1 == (FRenderStyle)0x0) {
    return false;
  }
  if ((FVar1 != (FRenderStyle)0x3) && (FVar1 != (FRenderStyle)0x1)) {
    return true;
  }
  if (((byte)this[3] & 2) == 0) {
    dVar2 = 1.0;
    if (alpha <= 1.0) {
      dVar2 = alpha;
    }
    dVar2 = (double)(-(ulong)(0.0 < alpha) & (ulong)dVar2);
  }
  else {
    dVar2 = 1.0;
  }
  FVar1 = this[1];
  if (FVar1 != (FRenderStyle)0x1) {
    dVar3 = dVar2;
    if (FVar1 != (FRenderStyle)0x2) {
      if (FVar1 != (FRenderStyle)0x3) goto LAB_005f31cc;
      dVar3 = 1.0 - dVar2;
    }
    if ((dVar3 == 0.0) && (!NAN(dVar3))) {
LAB_005f31cc:
      FVar1 = this[2];
      if (FVar1 == (FRenderStyle)0x3) {
        dVar2 = 1.0 - dVar2;
      }
      else if ((FVar1 != (FRenderStyle)0x2) && (dVar2 = 0.0, FVar1 == (FRenderStyle)0x1)) {
        dVar2 = 65536.0;
      }
      return (bool)(-(dVar2 != 1.0) & 1);
    }
  }
  return true;
}

Assistant:

bool FRenderStyle::IsVisible(double alpha) const throw()
{
	if (BlendOp == STYLEOP_None)
	{
		return false;
	}
	if (BlendOp == STYLEOP_Add || BlendOp == STYLEOP_RevSub)
	{
		if (Flags & STYLEF_Alpha1)
		{
			alpha = 1.;
		}
		else
		{
			alpha = clamp(alpha, 0., 1.);
		}
		return GetAlpha(SrcAlpha, alpha) != 0 || GetAlpha(DestAlpha, alpha) != 1;
	}
	// Treat anything else as visible.
	return true;
}